

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spread_volatile_semantics.cpp
# Opt level: O0

void __thiscall
spvtools::opt::SpreadVolatileSemantics::SetVolatileForLoadsInEntries
          (SpreadVolatileSemantics *this,Instruction *var,
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          *entry_function_ids)

{
  bool bVar1;
  uint32_t var_id;
  reference pvVar2;
  IRContext *this_00;
  anon_class_1_0_00000001 local_99;
  function<bool_(spvtools::opt::Instruction_*)> local_98;
  undefined1 local_78 [8];
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  funcs;
  _Node_iterator_base<unsigned_int,_false> _Stack_38;
  value_type_conflict2 entry_id;
  const_iterator __end2;
  const_iterator __begin2;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *__range2;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *entry_function_ids_local;
  Instruction *var_local;
  SpreadVolatileSemantics *this_local;
  
  __end2 = std::
           unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
           ::begin(entry_function_ids);
  _Stack_38._M_cur =
       (__node_type *)
       std::
       unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
       ::end(entry_function_ids);
  while( true ) {
    bVar1 = std::__detail::operator!=
                      (&__end2.super__Node_iterator_base<unsigned_int,_false>,
                       &stack0xffffffffffffffc8);
    if (!bVar1) break;
    pvVar2 = std::__detail::_Node_const_iterator<unsigned_int,_true,_false>::operator*(&__end2);
    funcs._M_h._M_single_bucket._4_4_ = *pvVar2;
    std::
    unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
    ::unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                     *)local_78);
    this_00 = Pass::context(&this->super_Pass);
    IRContext::CollectCallTreeFromRoots
              (this_00,funcs._M_h._M_single_bucket._4_4_,
               (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                *)local_78);
    var_id = Instruction::result_id(var);
    std::function<bool(spvtools::opt::Instruction*)>::
    function<spvtools::opt::SpreadVolatileSemantics::SetVolatileForLoadsInEntries(spvtools::opt::Instruction*,std::unordered_set<unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<unsigned_int>>const&)::__0,void>
              ((function<bool(spvtools::opt::Instruction*)> *)&local_98,&local_99);
    VisitLoadsOfPointersToVariableInEntries
              (this,var_id,&local_98,
               (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                *)local_78);
    std::function<bool_(spvtools::opt::Instruction_*)>::~function(&local_98);
    std::
    unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
    ::~unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                      *)local_78);
    std::__detail::_Node_const_iterator<unsigned_int,_true,_false>::operator++(&__end2);
  }
  return;
}

Assistant:

void SpreadVolatileSemantics::SetVolatileForLoadsInEntries(
    Instruction* var, const std::unordered_set<uint32_t>& entry_function_ids) {
  // Set Volatile memory operand for all load instructions if they do not have
  // it.
  for (auto entry_id : entry_function_ids) {
    std::unordered_set<uint32_t> funcs;
    context()->CollectCallTreeFromRoots(entry_id, &funcs);
    VisitLoadsOfPointersToVariableInEntries(
        var->result_id(),
        [](Instruction* load) {
          if (load->NumInOperands() <= kOpLoadInOperandMemoryOperands) {
            load->AddOperand({SPV_OPERAND_TYPE_MEMORY_ACCESS,
                              {uint32_t(spv::MemoryAccessMask::Volatile)}});
            return true;
          }
          uint32_t memory_operands =
              load->GetSingleWordInOperand(kOpLoadInOperandMemoryOperands);
          memory_operands |= uint32_t(spv::MemoryAccessMask::Volatile);
          load->SetInOperand(kOpLoadInOperandMemoryOperands, {memory_operands});
          return true;
        },
        funcs);
  }
}